

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadFunctionBody(BinaryReader *this,Offset end_offset)

{
  bool bVar1;
  Result result;
  Enum EVar2;
  Opcode local_24;
  Offset OStack_20;
  Opcode final_opcode;
  Offset end_offset_local;
  BinaryReader *this_local;
  
  OStack_20 = end_offset;
  Opcode::Opcode(&local_24,Invalid);
  result = ReadInstructions(this,false,OStack_20,&local_24);
  bVar1 = Failed(result);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else if ((this->state_).offset == OStack_20) {
    EVar2 = Opcode::operator_cast_to_Enum(&local_24);
    if (EVar2 == End) {
      Result::Result((Result *)((long)&this_local + 4),Ok);
    }
    else {
      PrintError(this,"function body must end with END opcode");
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
  }
  else {
    PrintError(this,"function body longer than given size");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadFunctionBody(Offset end_offset) {
  Opcode final_opcode(Opcode::Invalid);
  CHECK_RESULT(
      ReadInstructions(/*stop_on_end=*/false, end_offset, &final_opcode));
  ERROR_UNLESS(state_.offset == end_offset,
               "function body longer than given size");
  ERROR_UNLESS(final_opcode == Opcode::End,
               "function body must end with END opcode");
  return Result::Ok;
}